

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O0

void __thiscall DIS::Environment::unmarshal(Environment *this,DataStream *dataStream)

{
  DataStream *dataStream_local;
  Environment *this_local;
  
  DataStream::operator>>(dataStream,&this->_environmentType);
  DataStream::operator>>(dataStream,&this->_length);
  DataStream::operator>>(dataStream,&this->_index);
  DataStream::operator>>(dataStream,&this->_padding1);
  DataStream::operator>>(dataStream,&this->_geometry);
  DataStream::operator>>(dataStream,&this->_padding2);
  return;
}

Assistant:

void Environment::unmarshal(DataStream& dataStream)
{
    dataStream >> _environmentType;
    dataStream >> _length;
    dataStream >> _index;
    dataStream >> _padding1;
    dataStream >> _geometry;
    dataStream >> _padding2;
}